

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O3

DecodeStatus DecodeRRegsRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  MCRegisterClass *pMVar2;
  
  DVar1 = MCDisassembler_Fail;
  if (RegNo < 0x10) {
    pMVar2 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,0);
    MCOperand_CreateReg0(Inst,(uint)pMVar2->RegsBegin[RegNo]);
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeRRegsRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, void *Decoder)
{
	unsigned Reg;
	if (RegNo > 15)
		return MCDisassembler_Fail;

	Reg = getReg(Decoder, XCore_RRegsRegClassID, RegNo);
	MCOperand_CreateReg0(Inst, Reg);

	return MCDisassembler_Success;
}